

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O0

void mat4x4_look_at(vec4 *m,float *eye,float *center,float *up)

{
  float local_4c;
  float local_48;
  vec3 t;
  vec3 s;
  vec3 f;
  float *up_local;
  float *center_local;
  float *eye_local;
  vec4 *m_local;
  
  vec3_sub(s + 1,center,eye);
  vec3_norm(s + 1,s + 1);
  vec3_mul_cross(t + 1,s + 1,up);
  vec3_norm(t + 1,t + 1);
  vec3_mul_cross(&local_4c,t + 1,s + 1);
  (*m)[0] = t[1];
  (*m)[1] = local_4c;
  (*m)[2] = -s[1];
  (*m)[3] = 0.0;
  m[1][0] = t[2];
  m[1][1] = local_48;
  m[1][2] = -s[2];
  m[1][3] = 0.0;
  m[2][0] = s[0];
  m[2][1] = t[0];
  m[2][2] = -f[0];
  m[2][3] = 0.0;
  m[3][0] = 0.0;
  m[3][1] = 0.0;
  m[3][2] = 0.0;
  m[3][3] = 1.0;
  mat4x4_translate_in_place(m,-*eye,-eye[1],-eye[2]);
  return;
}

Assistant:

LINMATH_H_FUNC void mat4x4_look_at(mat4x4 m, vec3 const eye, vec3 const center, vec3 const up)
{
	/* Adapted from Android's OpenGL Matrix.java.                        */
	/* See the OpenGL GLUT documentation for gluLookAt for a description */
	/* of the algorithm. We implement it in a straightforward way:       */

	/* TODO: The negation of of can be spared by swapping the order of
	 *       operands in the following cross products in the right way. */
	vec3 f;
	vec3_sub(f, center, eye);	
	vec3_norm(f, f);	
	
	vec3 s;
	vec3_mul_cross(s, f, up);
	vec3_norm(s, s);

	vec3 t;
	vec3_mul_cross(t, s, f);

	m[0][0] =  s[0];
	m[0][1] =  t[0];
	m[0][2] = -f[0];
	m[0][3] =   0.f;

	m[1][0] =  s[1];
	m[1][1] =  t[1];
	m[1][2] = -f[1];
	m[1][3] =   0.f;

	m[2][0] =  s[2];
	m[2][1] =  t[2];
	m[2][2] = -f[2];
	m[2][3] =   0.f;

	m[3][0] =  0.f;
	m[3][1] =  0.f;
	m[3][2] =  0.f;
	m[3][3] =  1.f;

	mat4x4_translate_in_place(m, -eye[0], -eye[1], -eye[2]);
}